

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O3

void __thiscall QAbstractSpinBoxPrivate::updateEditFieldGeometry(QAbstractSpinBoxPrivate *this)

{
  QWidget *this_00;
  QWidget *this_01;
  QStyle *pQVar1;
  long in_FS_OFFSET;
  QStyleOptionSpinBox opt;
  QRect local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionSpinBox::QStyleOptionSpinBox((QStyleOptionSpinBox *)&local_78);
  (**(code **)(*(long *)this_00 + 0x1c0))(this_00,(QStyleOptionSpinBox *)&local_78);
  local_38 = (undefined1 *)CONCAT44(local_38._4_4_,(QFlagsStorageHelper<QStyle::SubControl,_4>)0x8);
  this_01 = &this->edit->super_QWidget;
  pQVar1 = QWidget::style(this_00);
  local_88 = (QRect)(**(code **)(*(long *)pQVar1 + 0xd8))
                              (pQVar1,0,(QStyleOptionSpinBox *)&local_78,8,this_00);
  QWidget::setGeometry(this_01,&local_88);
  QStyleOption::~QStyleOption((QStyleOption *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBoxPrivate::updateEditFieldGeometry()
{
    Q_Q(QAbstractSpinBox);
    QStyleOptionSpinBox opt;
    q->initStyleOption(&opt);
    opt.subControls = QStyle::SC_SpinBoxEditField;
    edit->setGeometry(q->style()->subControlRect(QStyle::CC_SpinBox, &opt,
                                                 QStyle::SC_SpinBoxEditField, q));
}